

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *other)

{
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *other_local;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (MemberInfo **)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)0x0;
  other->endPtr = (MemberInfo **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }